

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::VectorVarTest_DISABLED_Speed_Test::TestBody
          (VectorVarTest_DISABLED_Speed_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  pointer *__ptr;
  int iVar3;
  SEARCH_METHODS *pSVar4;
  long lVar5;
  bool bVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  int simd_var;
  int c_var;
  AssertionResult gtest_ar;
  int local_60;
  int local_5c;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  
  VectorVarTestBase::FillRandom((VectorVarTestBase *)this);
  iVar3 = 0;
  printf("Width = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_VectorVarTest).super_VectorVarTestBase.width,5000000);
  c_var = 0;
  ::aom_usec_timer_start(&c_timer_);
  lVar5 = 5000000;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    c_var = VectorVarTest::calcVarC(&this->super_VectorVarTest);
    iVar3 = iVar3 + c_var;
  }
  local_5c = iVar3;
  ::aom_usec_timer_mark(&c_timer_);
  simd_var = 0;
  ::aom_usec_timer_start(&simd_timer_);
  iVar3 = 0;
  lVar5 = 5000000;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    simd_var = VectorVarTest::calcVarSIMD(&this->super_VectorVarTest);
    iVar3 = iVar3 + simd_var;
  }
  local_60 = iVar3;
  ::aom_usec_timer_mark(&simd_timer_);
  uVar1 = ::aom_usec_timer_elapsed(&c_timer_);
  uVar2 = ::aom_usec_timer_elapsed(&simd_timer_);
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(int)uVar1 / (float)(int)uVar2),uVar1 & 0xffffffff,uVar2 & 0xffffffff);
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"c_var","simd_var",&c_var,&simd_var)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    std::operator<<((ostream *)(local_88._M_head_impl + 0x10),"Output mismatch \n");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2d9,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"sum_c_var","sum_simd_var",&local_5c,&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    std::operator<<((ostream *)(local_88._M_head_impl + 0x10),"Output mismatch \n");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2da,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(VectorVarTest, DISABLED_Speed) {
  FillRandom();
  const int numIter = 5000000;
  printf("Width = %d number of iteration is %d \n", width, numIter);

  int sum_c_var = 0;
  int c_var = 0;

  aom_usec_timer c_timer_;
  aom_usec_timer_start(&c_timer_);
  for (size_t i = 0; i < numIter; i++) {
    c_var = calcVarC();
    sum_c_var += c_var;
  }
  aom_usec_timer_mark(&c_timer_);

  int simd_var = 0;
  int sum_simd_var = 0;
  aom_usec_timer simd_timer_;
  aom_usec_timer_start(&simd_timer_);
  for (size_t i = 0; i < numIter; i++) {
    simd_var = calcVarSIMD();
    sum_simd_var += simd_var;
  }
  aom_usec_timer_mark(&simd_timer_);

  const int c_sum_time = static_cast<int>(aom_usec_timer_elapsed(&c_timer_));
  const int simd_sum_time =
      static_cast<int>(aom_usec_timer_elapsed(&simd_timer_));

  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n", c_sum_time,
         simd_sum_time,
         (static_cast<float>(c_sum_time) / static_cast<float>(simd_sum_time)));

  EXPECT_EQ(c_var, simd_var) << "Output mismatch \n";
  EXPECT_EQ(sum_c_var, sum_simd_var) << "Output mismatch \n";
}